

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_> *
__thiscall
llvm::DWARFUnit::findRnglistFromIndex
          (Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
           *__return_storage_ptr__,DWARFUnit *this,uint32_t Index)

{
  long lVar1;
  char *pcVar2;
  error_code EC;
  error_code EC_00;
  Error local_30;
  Error local_28;
  uint32_t local_1c;
  uint32_t Index_local;
  
  local_1c = Index;
  if ((this->RngListTable).Storage.hasVal == true) {
    lVar1 = (long)(this->RngListTable).Storage.field_0.value.
                  super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)Index <
        (ulong)((long)*(pointer *)
                       ((long)&(this->RngListTable).Storage.field_0.value.
                               super_DWARFListTableBase<llvm::DWARFDebugRnglist>.Header.Offsets.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8
                       ) - lVar1 >> 3)) {
      findRnglistFromOffset
                (__return_storage_ptr__,this,
                 this->RangeSectionBase + *(long *)(lVar1 + (ulong)Index * 8));
      return __return_storage_ptr__;
    }
    pcVar2 = (char *)std::_V2::generic_category();
    EC_00._M_cat = (error_category *)0x16;
    EC_00._0_8_ = &local_30;
    createStringError<unsigned_int>(EC_00,pcVar2,(uint *)"invalid range list table index %d");
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    Expected(__return_storage_ptr__,&local_30);
  }
  else {
    pcVar2 = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = &local_28;
    createStringError(EC,pcVar2);
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    Expected(__return_storage_ptr__,&local_28);
    local_30.Payload = local_28.Payload;
  }
  if ((long *)((ulong)local_30.Payload & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)((ulong)local_30.Payload & 0xfffffffffffffffe) + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<DWARFAddressRangesVector>
DWARFUnit::findRnglistFromIndex(uint32_t Index) {
  if (auto Offset = getRnglistOffset(Index))
    return findRnglistFromOffset(*Offset + RangeSectionBase);

  if (RngListTable)
    return createStringError(errc::invalid_argument,
                             "invalid range list table index %d", Index);

  return createStringError(errc::invalid_argument,
                           "missing or invalid range list table");
}